

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O3

void __thiscall
OpenMD::RadialDistrFunc::RadialDistrFunc
          (RadialDistrFunc *this,SimInfo *info,string *filename,string *sele1,string *sele2,
          uint nbins)

{
  SelectionEvaluator *this_00;
  SelectionEvaluator *this_01;
  SelectionManager *this_02;
  SelectionManager *this_03;
  pointer pcVar1;
  pointer piVar2;
  pointer piVar3;
  pointer ppSVar4;
  pointer ppSVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppBVar8;
  pointer ppBVar9;
  pointer ppTVar10;
  pointer ppTVar11;
  pointer ppIVar12;
  pointer ppIVar13;
  pointer ppMVar14;
  pointer ppMVar15;
  int iVar16;
  long lVar17;
  SelectionManager local_148;
  SelectionManager *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  SelectionManager *local_68;
  SelectionManager *local_60;
  string *local_58;
  string *local_50;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_48;
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__RadialDistrFunc_00337260;
  local_70 = &(this->selectionScript1_).field_2;
  (this->selectionScript1_)._M_dataplus._M_p = (pointer)local_70;
  pcVar1 = (sele1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript1_,pcVar1,pcVar1 + sele1->_M_string_length);
  local_78 = &(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)local_78;
  pcVar1 = (sele2->_M_dataplus)._M_p;
  local_50 = &this->selectionScript1_;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selectionScript2_,pcVar1,pcVar1 + sele2->_M_string_length);
  this_00 = &this->evaluator1_;
  local_58 = &this->selectionScript2_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_01 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(this_01,info);
  this_02 = &this->seleMan1_;
  SelectionManager::SelectionManager(this_02,info);
  this_03 = &this->seleMan2_;
  SelectionManager::SelectionManager(this_03,info);
  local_60 = &this->sele1_minus_common_;
  SelectionManager::SelectionManager(local_60,info);
  local_68 = &this->sele2_minus_common_;
  SelectionManager::SelectionManager(local_68,info);
  local_80 = &this->common_;
  SelectionManager::SelectionManager(local_80,info);
  SelectionEvaluator::loadScriptString(this_00,sele1);
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_148,this_00);
    lVar17 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar17),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_148.info_)->_vptr_SimInfo + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (lVar17 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_148);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xb])(this,this_02);
  }
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_148,this_01);
    lVar17 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start.super__Bit_iterator_base._M_p + lVar17),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(local_148.info_)->_vptr_SimInfo + lVar17));
      lVar17 = lVar17 + 0x28;
    } while (lVar17 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_148);
    (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xc])(this,this_03);
  }
  if (((this->evaluator1_).isDynamic_ == false) && ((this->evaluator2_).isDynamic_ == false)) {
    operator&(&local_148,this_02,this_03);
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).info_ = local_148.info_;
    (this->common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_48);
    piVar2 = (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)piVar3 - (long)piVar2);
    }
    ppSVar4 = (this->common_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (this->common_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar4 != (pointer)0x0) {
      operator_delete(ppSVar4,(long)ppSVar5 - (long)ppSVar4);
    }
    ppBVar6 = (this->common_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar7 = (this->common_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->common_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->common_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->common_).bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar6 != (pointer)0x0) {
      operator_delete(ppBVar6,(long)ppBVar7 - (long)ppBVar6);
    }
    ppBVar8 = (this->common_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar9 = (this->common_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->common_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->common_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->common_).bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar8 != (pointer)0x0) {
      operator_delete(ppBVar8,(long)ppBVar9 - (long)ppBVar8);
    }
    ppTVar10 = (this->common_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar11 = (this->common_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppTVar10 != (pointer)0x0) {
      operator_delete(ppTVar10,(long)ppTVar11 - (long)ppTVar10);
    }
    ppIVar12 = (this->common_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar13 = (this->common_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (this->common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar12 != (pointer)0x0) {
      operator_delete(ppIVar12,(long)ppIVar13 - (long)ppIVar12);
    }
    ppMVar14 = (this->common_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppMVar15 = (this->common_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppMVar14 != (pointer)0x0) {
      operator_delete(ppMVar14,(long)ppMVar15 - (long)ppMVar14);
    }
    SelectionManager::~SelectionManager(&local_148);
    operator-(&local_148,this_02,local_80);
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->sele1_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->sele1_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->sele1_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).info_ = local_148.info_;
    (this->sele1_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_48);
    piVar2 = (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)piVar3 - (long)piVar2);
    }
    ppSVar4 = (this->sele1_minus_common_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (this->sele1_minus_common_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar4 != (pointer)0x0) {
      operator_delete(ppSVar4,(long)ppSVar5 - (long)ppSVar4);
    }
    ppBVar6 = (this->sele1_minus_common_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar7 = (this->sele1_minus_common_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).bonds_.
    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).bonds_.
    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).bonds_.
    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar6 != (pointer)0x0) {
      operator_delete(ppBVar6,(long)ppBVar7 - (long)ppBVar6);
    }
    ppBVar8 = (this->sele1_minus_common_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar9 = (this->sele1_minus_common_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).bends_.
    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).bends_.
    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).bends_.
    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar8 != (pointer)0x0) {
      operator_delete(ppBVar8,(long)ppBVar9 - (long)ppBVar8);
    }
    ppTVar10 = (this->sele1_minus_common_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar11 = (this->sele1_minus_common_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppTVar10 != (pointer)0x0) {
      operator_delete(ppTVar10,(long)ppTVar11 - (long)ppTVar10);
    }
    ppIVar12 = (this->sele1_minus_common_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar13 = (this->sele1_minus_common_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar12 != (pointer)0x0) {
      operator_delete(ppIVar12,(long)ppIVar13 - (long)ppIVar12);
    }
    ppMVar14 = (this->sele1_minus_common_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppMVar15 = (this->sele1_minus_common_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->sele1_minus_common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele1_minus_common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele1_minus_common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppMVar14 != (pointer)0x0) {
      operator_delete(ppMVar14,(long)ppMVar15 - (long)ppMVar14);
    }
    SelectionManager::~SelectionManager(&local_148);
    operator-(&local_148,this_03,local_80);
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (this->sele2_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_start =
         (this->sele2_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_48.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
    .super__Vector_impl_data._M_finish =
         (this->sele2_minus_common_).ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).info_ = local_148.info_;
    (this->sele2_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.ss_.bitsets_.
         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.ss_.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector(&local_48);
    piVar2 = (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar3 = (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2,(long)piVar3 - (long)piVar2);
    }
    ppSVar4 = (this->sele2_minus_common_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppSVar5 = (this->sele2_minus_common_).stuntdoubles_.
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.stuntdoubles_.
         super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.stuntdoubles_.
    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppSVar4 != (pointer)0x0) {
      operator_delete(ppSVar4,(long)ppSVar5 - (long)ppSVar4);
    }
    ppBVar6 = (this->sele2_minus_common_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar7 = (this->sele2_minus_common_).bonds_.
              super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).bonds_.
    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).bonds_.
    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).bonds_.
    super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.bonds_.super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar6 != (pointer)0x0) {
      operator_delete(ppBVar6,(long)ppBVar7 - (long)ppBVar6);
    }
    ppBVar8 = (this->sele2_minus_common_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppBVar9 = (this->sele2_minus_common_).bends_.
              super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).bends_.
    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).bends_.
    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).bends_.
    super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.bends_.super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppBVar8 != (pointer)0x0) {
      operator_delete(ppBVar8,(long)ppBVar9 - (long)ppBVar8);
    }
    ppTVar10 = (this->sele2_minus_common_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar11 = (this->sele2_minus_common_).torsions_.
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).torsions_.
    super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.torsions_.
         super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.torsions_.super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppTVar10 != (pointer)0x0) {
      operator_delete(ppTVar10,(long)ppTVar11 - (long)ppTVar10);
    }
    ppIVar12 = (this->sele2_minus_common_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar13 = (this->sele2_minus_common_).inversions_.
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.inversions_.
         super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.inversions_.
    super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppIVar12 != (pointer)0x0) {
      operator_delete(ppIVar12,(long)ppIVar13 - (long)ppIVar12);
    }
    ppMVar14 = (this->sele2_minus_common_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppMVar15 = (this->sele2_minus_common_).molecules_.
               super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (this->sele2_minus_common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->sele2_minus_common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->sele2_minus_common_).molecules_.
    super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_148.molecules_.
         super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.molecules_.super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppMVar14 != (pointer)0x0) {
      operator_delete(ppMVar14,(long)ppMVar15 - (long)ppMVar14);
    }
    SelectionManager::~SelectionManager(&local_148);
    iVar16 = OpenMDBitSet::countBits
                       ((this->seleMan1_).ss_.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    this->nSelected1_ = iVar16;
    iVar16 = OpenMDBitSet::countBits
                       ((this->seleMan2_).ss_.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    this->nSelected2_ = iVar16;
    iVar16 = OpenMDBitSet::countBits
                       ((this->common_).ss_.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    this->nPairs_ = this->nSelected2_ * this->nSelected1_ - ((iVar16 + 1) * iVar16) / 2;
  }
  return;
}

Assistant:

RadialDistrFunc::RadialDistrFunc(SimInfo* info, const std::string& filename,
                                   const std::string& sele1,
                                   const std::string& sele2,
                                   unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      selectionScript1_(sele1), selectionScript2_(sele2), evaluator1_(info),
      evaluator2_(info), seleMan1_(info), seleMan2_(info),
      sele1_minus_common_(info), sele2_minus_common_(info), common_(info) {
    evaluator1_.loadScriptString(sele1);
    evaluator2_.loadScriptString(sele2);

    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection1(seleMan1_);
    }
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection2(seleMan2_);
    }

    if (!evaluator1_.isDynamic() && !evaluator2_.isDynamic()) {
      // If all selections are static, we can precompute the number
      // of real pairs.
      common_             = seleMan1_ & seleMan2_;
      sele1_minus_common_ = seleMan1_ - common_;
      sele2_minus_common_ = seleMan2_ - common_;

      nSelected1_    = seleMan1_.getSelectionCount();
      nSelected2_    = seleMan2_.getSelectionCount();
      int nIntersect = common_.getSelectionCount();

      nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
    }
  }